

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall
crypto_tests::CryptoTest::
TestVector<CRIPEMD160,std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (CryptoTest *this,CRIPEMD160 *h,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long uVar3;
  size_type sVar4;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  size_t len;
  size_t pos;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  CRIPEMD160 hasher;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  CRIPEMD160 *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  lazy_ostream *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  ulong local_358;
  int local_350;
  lazy_ostream local_300 [2];
  assertion_result local_2e0 [2];
  lazy_ostream local_288 [2];
  assertion_result local_268 [2];
  const_string local_230 [2];
  lazy_ostream local_210 [2];
  assertion_result local_1f0 [2];
  const_string local_1b8 [2];
  lazy_ostream local_198 [2];
  assertion_result local_178 [3];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbc8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               (unsigned_long)in_stack_fffffffffffffbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
               (const_string *)in_stack_fffffffffffffc00,
               CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
               (const_string *)in_stack_fffffffffffffbf0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbc8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (bool)in_stack_fffffffffffffbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               (unsigned_long)in_stack_fffffffffffffbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               (unsigned_long)in_stack_fffffffffffffbc8);
    in_stack_fffffffffffffbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_178,local_198,local_1b8,0x25,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffbc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbc8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
             (size_type)in_stack_fffffffffffffbe0);
  local_18 = in_RSI[10];
  uStack_10 = in_RSI[0xb];
  local_28 = in_RSI[8];
  uStack_20 = in_RSI[9];
  local_68 = *in_RSI;
  uStack_60 = in_RSI[1];
  local_58 = in_RSI[2];
  uStack_50 = in_RSI[3];
  local_48 = in_RSI[4];
  uStack_40 = in_RSI[5];
  local_38 = in_RSI[6];
  uStack_30 = in_RSI[7];
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
            (in_stack_fffffffffffffbc8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_fffffffffffffbc8);
  CRIPEMD160::Write((CRIPEMD160 *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                    (uchar *)in_stack_fffffffffffffbe0,
                    CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbc8);
  CRIPEMD160::Finalize
            (in_stack_fffffffffffffbe0,
             (uchar *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               (unsigned_long)in_stack_fffffffffffffbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
               (const_string *)in_stack_fffffffffffffc00,
               CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
               (const_string *)in_stack_fffffffffffffbf0);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffffbf0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (bool)in_stack_fffffffffffffbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               (unsigned_long)in_stack_fffffffffffffbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               (unsigned_long)in_stack_fffffffffffffbc8);
    in_stack_fffffffffffffbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1f0,local_210,local_230,0x2a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffbc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (local_350 = 0; local_350 < 0x20; local_350 = local_350 + 1) {
    memcpy(&local_c8,in_RSI,0x60);
    local_358 = 0;
    while (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(in_stack_fffffffffffffbc8), local_358 < sVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_stack_fffffffffffffbc8);
      uVar3 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                        (in_stack_fffffffffffffbf0,
                         CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                (in_stack_fffffffffffffbc8);
      CRIPEMD160::Write((CRIPEMD160 *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                        (uchar *)in_stack_fffffffffffffbe0,
                        CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
      local_358 = uVar3 + local_358;
      if (local_358 != 0) {
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffbc8);
        sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(in_stack_fffffffffffffbc8);
        if ((sVar2 < local_358 + sVar4 * 2) &&
           (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(in_stack_fffffffffffffbc8), local_358 < sVar2)) {
          local_d8 = local_78;
          uStack_d0 = uStack_70;
          local_e8 = local_88;
          uStack_e0 = uStack_80;
          local_f8 = local_98;
          uStack_f0 = uStack_90;
          local_108 = local_a8;
          uStack_100 = uStack_a0;
          local_118 = local_b8;
          uStack_110 = uStack_b0;
          local_128 = local_c8;
          uStack_120 = uStack_c0;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                    (in_stack_fffffffffffffbc8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_stack_fffffffffffffbc8);
          CRIPEMD160::Write((CRIPEMD160 *)
                            CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                            (uchar *)in_stack_fffffffffffffbe0,
                            CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffbc8);
          CRIPEMD160::Finalize
                    (in_stack_fffffffffffffbe0,
                     (uchar *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                       (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                       (unsigned_long)in_stack_fffffffffffffbc8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)
                       CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                       (const_string *)in_stack_fffffffffffffc00,
                       CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                       (const_string *)in_stack_fffffffffffffbf0);
            in_stack_fffffffffffffc0f =
                 std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffbf0);
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)
                       CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                       (bool)in_stack_fffffffffffffbd7);
            in_stack_fffffffffffffc00 = boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                       (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                       (unsigned_long)in_stack_fffffffffffffbc8);
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0)
                       ,(basic_cstring<const_char> *)in_stack_fffffffffffffbc8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                       (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                       (unsigned_long)in_stack_fffffffffffffbc8);
            in_stack_fffffffffffffbc8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_268,local_288,(const_string *)&stack0xfffffffffffffd58,0x37,CHECK,
                       CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_fffffffffffffbc8);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffffbc8);
            in_stack_fffffffffffffbff = boost::test_tools::tt_detail::dummy_cond();
          } while ((bool)in_stack_fffffffffffffbff);
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbc8);
    CRIPEMD160::Finalize
              (in_stack_fffffffffffffbe0,
               (uchar *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
    do {
      in_stack_fffffffffffffbf0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                 (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                 (unsigned_long)in_stack_fffffffffffffbc8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                 (const_string *)in_stack_fffffffffffffc00,
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (const_string *)in_stack_fffffffffffffbf0);
      in_stack_fffffffffffffbef =
           std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffbf0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                 (bool)in_stack_fffffffffffffbd7);
      in_stack_fffffffffffffbe0 = (CRIPEMD160 *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                 (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                 (unsigned_long)in_stack_fffffffffffffbc8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffbc8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                 (pointer)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                 (unsigned_long)in_stack_fffffffffffffbc8);
      in_stack_fffffffffffffbc8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2e0,local_300,(const_string *)&stack0xfffffffffffffce0,0x3b,CHECK,CHECK_PRED)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffbc8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffbc8);
      in_stack_fffffffffffffbdf = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffbdf);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestVector(const Hasher &h, const In &in, const Out &out) {
    Out hash;
    BOOST_CHECK(out.size() == h.OUTPUT_SIZE);
    hash.resize(out.size());
    {
        // Test that writing the whole input string at once works.
        Hasher(h).Write((const uint8_t*)in.data(), in.size()).Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
    for (int i=0; i<32; i++) {
        // Test that writing the string broken up in random pieces works.
        Hasher hasher(h);
        size_t pos = 0;
        while (pos < in.size()) {
            size_t len = m_rng.randrange((in.size() - pos + 1) / 2 + 1);
            hasher.Write((const uint8_t*)in.data() + pos, len);
            pos += len;
            if (pos > 0 && pos + 2 * out.size() > in.size() && pos < in.size()) {
                // Test that writing the rest at once to a copy of a hasher works.
                Hasher(hasher).Write((const uint8_t*)in.data() + pos, in.size() - pos).Finalize(hash.data());
                BOOST_CHECK(hash == out);
            }
        }
        hasher.Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
}